

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro256plus.hpp
# Opt level: O2

vector<trng::GF2,_256UL> * __thiscall
trng::xoshiro256plus::status_type::to_vector
          (vector<trng::GF2,_256UL> *__return_storage_ptr__,status_type *this)

{
  int i;
  long lVar1;
  
  vector<trng::GF2,_256UL>::vector(__return_storage_ptr__);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl
    .super__Vector_impl_data._M_start[lVar1].value =
         (byte)((this->r[0] << ((byte)lVar1 & 0x3f)) >> 0x3f);
  }
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl
    .super__Vector_impl_data._M_start[lVar1 + 0x40].value =
         (byte)((this->r[1] << ((byte)lVar1 & 0x3f)) >> 0x3f);
  }
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl
    .super__Vector_impl_data._M_start[lVar1 + 0x80].value =
         (byte)((this->r[2] << ((byte)lVar1 & 0x3f)) >> 0x3f);
  }
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl
    .super__Vector_impl_data._M_start[lVar1 + 0xc0].value =
         (byte)((this->r[3] << ((byte)lVar1 & 0x3f)) >> 0x3f);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<GF2, 256> to_vector() const {
        vector<GF2, 256> res;
        const result_type mask{result_type(1) << 63};
        for (int i{0}; i < 64; ++i)
          res(i) = GF2(((r[0] << i) & mask) > 0);
        for (int i{0}; i < 64; ++i)
          res(i + 64) = GF2(((r[1] << i) & mask) > 0);
        for (int i{0}; i < 64; ++i)
          res(i + 2 * 64) = GF2(((r[2] << i) & mask) > 0);
        for (int i{0}; i < 64; ++i)
          res(i + 3 * 64) = GF2(((r[3] << i) & mask) > 0);
        return res;
      }